

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cpp
# Opt level: O0

int __thiscall
Filter::searchRadius
          (Filter *this,TRIPLEYCbCr **mrx,TRIPLEYCbCr **mrxNoize,int min,int max,
          BITMAPFILEHEADER bmFile,BITMAPINFOHEADER bmInfo,char *filepath,double sigma)

{
  void *pvVar1;
  BITMAPINFOHEADER bmInfo_00;
  BITMAPFILEHEADER bmFile_00;
  BITMAPFILEHEADER BVar2;
  BITMAPINFOHEADER BVar3;
  uint uVar4;
  uint uVar5;
  undefined8 mrx_00;
  int iVar6;
  char *pcVar7;
  undefined4 extraout_var;
  int local_18c;
  undefined1 local_188 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  BITMAPINFOHEADER local_128;
  BITMAPFILEHEADER local_f8;
  undefined1 local_e0 [8];
  string filename;
  TRIPLERGB **mrxf;
  undefined1 local_b0 [4];
  int r;
  allocator local_79;
  undefined1 local_78 [8];
  string path;
  double psnr;
  double dStack_48;
  int maxRadius;
  double maxPSNR;
  int w;
  int h;
  double sigma_local;
  char *filepath_local;
  int max_local;
  int min_local;
  TRIPLEYCbCr **mrxNoize_local;
  TRIPLEYCbCr **mrx_local;
  Filter *this_local;
  
  BVar3 = bmInfo;
  BVar2 = bmFile;
  printf("Search radius(%s):\n",filepath);
  uVar5 = bmInfo.biHeight;
  uVar4 = bmInfo.biWidth;
  dStack_48 = 0.0;
  psnr._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_78,filepath,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "mkdir -p ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  system(pcVar7);
  std::__cxx11::string::~string((string *)local_b0);
  for (mrxf._4_4_ = min; (int)mrxf._4_4_ < max; mrxf._4_4_ = mrxf._4_4_ + 1) {
    iVar6 = (**this->_vptr_Filter)
                      (SUB84(sigma,0),this,mrxNoize,(ulong)uVar5,(ulong)uVar4,(ulong)mrxf._4_4_);
    filename.field_2._8_8_ = CONCAT44(extraout_var,iVar6);
    path.field_2._8_8_ =
         (size_type)
         getPSNR((TRIPLEBYTES **)mrx,filename.field_2._8_8_,mrxf._4_4_,mrxf._4_4_,uVar5 - mrxf._4_4_
                 ,uVar4 - mrxf._4_4_,0);
    if (dStack_48 < (double)path.field_2._8_8_) {
      psnr._4_4_ = mrxf._4_4_;
      dStack_48 = (double)path.field_2._8_8_;
    }
    printf("R = %3d\tPSNR[f,f] = %5.3f\n",(int)path.field_2._8_8_,(ulong)mrxf._4_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                   "/radius_");
    mrx_00 = filename.field_2._8_8_;
    bmFile._0_8_ = BVar2._0_8_;
    local_f8.bfType = bmFile.bfType;
    local_f8._2_2_ = bmFile._2_2_;
    local_f8.bfSize = bmFile.bfSize;
    bmFile._8_8_ = BVar2._8_8_;
    local_f8.bfReserved1 = bmFile.bfReserved1;
    local_f8.bfReserved2 = bmFile.bfReserved2;
    local_f8.bfOffBits = bmFile.bfOffBits;
    bmInfo._32_8_ = BVar3._32_8_;
    local_128.biClrUsed = bmInfo.biClrUsed;
    local_128.biClrImportant = bmInfo.biClrImportant;
    bmInfo._0_8_ = BVar3._0_8_;
    local_128.biSize = bmInfo.biSize;
    local_128.biWidth = bmInfo.biWidth;
    bmInfo._8_8_ = BVar3._8_8_;
    local_128.biHeight = bmInfo.biHeight;
    local_128.biPlanes = bmInfo.biPlanes;
    local_128.biBitCount = bmInfo.biBitCount;
    bmInfo._16_8_ = BVar3._16_8_;
    local_128.biCompression = bmInfo.biCompression;
    local_128.biSizeImage = bmInfo.biSizeImage;
    bmInfo._24_8_ = BVar3._24_8_;
    local_128.biXPelsPerMeter = bmInfo.biXPelsPerMeter;
    local_128.biYPelsPerMeter = bmInfo.biYPelsPerMeter;
    std::__cxx11::to_string((string *)local_188,mrxf._4_4_);
    std::operator+(&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
    std::operator+(&local_148,&local_168,".bmp");
    pcVar7 = (char *)std::__cxx11::string::c_str();
    bmFile_00.bfReserved1 = local_f8.bfReserved1;
    bmFile_00.bfReserved2 = local_f8.bfReserved2;
    bmFile_00.bfOffBits = local_f8.bfOffBits;
    bmFile_00.bfType = local_f8.bfType;
    bmFile_00._2_2_ = local_f8._2_2_;
    bmFile_00.bfSize = local_f8.bfSize;
    bmInfo_00.biHeight = local_128.biHeight;
    bmInfo_00.biPlanes = local_128.biPlanes;
    bmInfo_00.biBitCount = local_128.biBitCount;
    bmInfo_00.biSize = local_128.biSize;
    bmInfo_00.biWidth = local_128.biWidth;
    bmInfo_00.biCompression = local_128.biCompression;
    bmInfo_00.biSizeImage = local_128.biSizeImage;
    bmInfo_00.biXPelsPerMeter = local_128.biXPelsPerMeter;
    bmInfo_00.biYPelsPerMeter = local_128.biYPelsPerMeter;
    bmInfo_00.biClrUsed = local_128.biClrUsed;
    bmInfo_00.biClrImportant = local_128.biClrImportant;
    save_component_to_files((TRIPLEBYTES **)mrx_00,bmFile_00,bmInfo_00,0,pcVar7);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)local_188);
    for (local_18c = 0; local_18c < (int)uVar5; local_18c = local_18c + 1) {
      pvVar1 = *(void **)(filename.field_2._8_8_ + (long)local_18c * 8);
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
    }
    if (filename.field_2._8_8_ != 0) {
      operator_delete__((void *)filename.field_2._8_8_);
    }
    std::__cxx11::string::~string((string *)local_e0);
  }
  std::__cxx11::string::~string((string *)local_78);
  return psnr._4_4_;
}

Assistant:

int Filter::searchRadius(TRIPLEYCbCr **mrx, TRIPLEYCbCr **mrxNoize, int min, int max, BITMAPFILEHEADER bmFile,
                         BITMAPINFOHEADER bmInfo, const char *filepath, double sigma) {
    printf("Search radius(%s):\n", filepath);
    int h = bmInfo.biHeight;
    int w = bmInfo.biWidth;
    double maxPSNR = 0;
    int maxRadius = 0;
    double psnr;
    std::string path = filepath;
    system(("mkdir -p " + path).c_str());
    for (int r = min; r < max; r++) {
        TRIPLERGB **mrxf = (TRIPLERGB **) apply_filter(mrxNoize, h, w, r, sigma);
        psnr = getPSNR((TRIPLEBYTES **) mrx, (TRIPLEBYTES **) mrxf, r, r, h - r, w - r, COMPONENT_Y);
        if (maxPSNR < psnr) {
            maxPSNR = psnr;
            maxRadius = r;
        }
        printf("R = %3d\tPSNR[f,f] = %5.3f\n", r, psnr);
        std::string filename = path + "/radius_";//.bmp";
        save_component_to_files((TRIPLEBYTES **) mrxf, bmFile, bmInfo, COMPONENT_Y,
                                (filename + std::to_string(r) + ".bmp").c_str());
        for (int i = 0; i < h; i++) {
            delete[]mrxf[i];
        }
        delete[] mrxf;
    }
    return maxRadius;
}